

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall despot::Parser::PrintObs(Parser *this,OBS_TYPE obs,ostream *out)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  ostream *poVar5;
  string *psVar6;
  char *pcVar7;
  int local_54;
  int local_50;
  int o_1;
  int o;
  allocator<int> local_39;
  undefined1 local_38 [8];
  vector<int,_std::allocator<int>_> obs_vec;
  ostream *out_local;
  OBS_TYPE obs_local;
  Parser *this_local;
  
  obs_vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)out;
  sVar2 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::size(&this->obs_vars_);
  std::allocator<int>::allocator(&local_39);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_38,sVar2,&local_39);
  std::allocator<int>::~allocator(&local_39);
  sVar2 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::size(&this->obs_vars_);
  local_50 = (int)sVar2;
  out_local = (ostream *)obs;
  while (local_50 = local_50 + -1, -1 < local_50) {
    pvVar3 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::operator[]
                       (&this->obs_vars_,(long)local_50);
    iVar1 = Variable::Size(&pvVar3->super_Variable);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_38,(long)local_50);
    *pvVar4 = (value_type)((ulong)out_local % (ulong)(long)iVar1);
    pvVar3 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::operator[]
                       (&this->obs_vars_,(long)local_50);
    iVar1 = Variable::Size(&pvVar3->super_Variable);
    out_local = (ostream *)((ulong)out_local / (ulong)(long)iVar1);
  }
  std::operator<<((ostream *)
                  obs_vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,"[");
  local_54 = 0;
  while( true ) {
    sVar2 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::size(&this->obs_vars_)
    ;
    if (sVar2 <= (ulong)(long)local_54) break;
    pcVar7 = ", ";
    if (local_54 == 0) {
      pcVar7 = "";
    }
    poVar5 = std::operator<<((ostream *)
                             obs_vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,pcVar7);
    pvVar3 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::operator[]
                       (&this->obs_vars_,(long)local_54);
    psVar6 = NamedVar::name_abi_cxx11_(pvVar3);
    poVar5 = std::operator<<(poVar5,(string *)psVar6);
    poVar5 = std::operator<<(poVar5,":");
    pvVar3 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::operator[]
                       (&this->obs_vars_,(long)local_54);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_38,(long)local_54);
    psVar6 = Variable::GetValue_abi_cxx11_(&pvVar3->super_Variable,*pvVar4);
    std::operator<<(poVar5,(string *)psVar6);
    local_54 = local_54 + 1;
  }
  poVar5 = std::operator<<((ostream *)
                           obs_vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,"]");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_38);
  return;
}

Assistant:

void Parser::PrintObs(OBS_TYPE obs, ostream& out) const {
	vector<int> obs_vec(obs_vars_.size());
	for (int o = obs_vars_.size() - 1; o >= 0; o--) {
		obs_vec[o] = obs % obs_vars_[o].Size();
		obs /= obs_vars_[o].Size();
	}

	out << "[";
	for (int o = 0; o < obs_vars_.size(); o++) {
		out << (o == 0 ? "" : ", ") << obs_vars_[o].name() << ":"
			<< obs_vars_[o].GetValue(obs_vec[o]);
	}
	out << "]" << endl;
}